

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

bool __thiscall
FreeTypeFaceWrapper::IsDefiningCharsNotInAdobeStandardLatin(FreeTypeFaceWrapper *this)

{
  bool bVar1;
  FT_ULong inCharacterCode;
  FT_Face pFVar2;
  FT_UInt glyphIndex;
  FT_UInt local_1c;
  
  pFVar2 = this->mFace;
  if (pFVar2 == (FT_Face)0x0) {
    bVar1 = false;
  }
  else {
    inCharacterCode = FT_Get_First_Char(pFVar2,&local_1c);
    bVar1 = IsCharachterCodeAdobeStandard((FreeTypeFaceWrapper *)pFVar2,inCharacterCode);
    if ((bVar1) && (local_1c != 0)) {
      do {
        pFVar2 = this->mFace;
        inCharacterCode = FT_Get_Next_Char(pFVar2,inCharacterCode,&local_1c);
        bVar1 = IsCharachterCodeAdobeStandard((FreeTypeFaceWrapper *)pFVar2,inCharacterCode);
        if (!bVar1) break;
      } while (local_1c != 0);
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  return bVar1;
}

Assistant:

bool FreeTypeFaceWrapper::IsDefiningCharsNotInAdobeStandardLatin()
{
	if(mFace)
	{
		// loop charachters in font, till you find a non Adobe Standard Latin. hmm. seems like this method marks all as symbol...
		// need to think about this...
		bool hasOnlyAdobeStandard = true;
		FT_ULong characterCode;
		FT_UInt glyphIndex;
		
		characterCode = FT_Get_First_Char(mFace,&glyphIndex);
		hasOnlyAdobeStandard = IsCharachterCodeAdobeStandard(characterCode);
		while(hasOnlyAdobeStandard && glyphIndex != 0)
		{
			characterCode = FT_Get_Next_Char(mFace, characterCode, &glyphIndex);
			hasOnlyAdobeStandard = IsCharachterCodeAdobeStandard(characterCode);
		}
		return !hasOnlyAdobeStandard;
	}
	else
		return false;
}